

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int buffon_box_sample(double a,double b,double l,int trial_num)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double y2;
  double y1;
  double x2;
  double x1;
  int trial;
  double r8_pi;
  int hits;
  double angle;
  int trial_num_local;
  double l_local;
  double b_local;
  double a_local;
  
  r8_pi._4_4_ = 0;
  for (x1._4_4_ = 1; x1._4_4_ <= trial_num; x1._4_4_ = x1._4_4_ + 1) {
    iVar1 = rand();
    iVar2 = rand();
    iVar3 = rand();
    dVar4 = ((double)iVar3 * 6.283185307179586) / 2147483647.0;
    dVar5 = cos(dVar4);
    dVar5 = l * dVar5 + (a * (double)iVar1) / 2147483647.0;
    dVar4 = sin(dVar4);
    dVar4 = l * dVar4 + (b * (double)iVar2) / 2147483647.0;
    if ((((dVar5 <= 0.0) || (a <= dVar5)) || (dVar4 <= 0.0)) || (b <= dVar4)) {
      r8_pi._4_4_ = r8_pi._4_4_ + 1;
    }
  }
  return r8_pi._4_4_;
}

Assistant:

int buffon_box_sample ( double a, double b, double l, int trial_num )

//****************************************************************************80
//
//  Purpose:
//
//    BUFFON_BOX_SAMPLE samples the Buffon Box distribution.
//
//  Discussion:
//
//    In the Buffon-Laplace needle experiment, we suppose that the plane has
//    been tiled into a grid of rectangles of width A and height B, and that a
//    needle of length L is dropped "at random" onto this grid.
//
//    We may assume that one end, the "eye" of the needle falls at the point
//    (X1,Y1), taken uniformly at random in the cell [0,A]x[0,B].
//
//    ANGLE, the angle that the needle makes is taken to be uniformly random.
//    The point of the needle, (X2,Y2), therefore lies at
//
//      (X2,Y2) = ( X1+L*cos(ANGLE), Y1+L*sin(ANGLE) )
//
//    The needle will have crossed at least one grid line if any of the
//    following are true:
//
//      X2 <= 0, A <= X2, Y2 <= 0, B <= Y2.
//
//    This routine simulates the tossing of the needle, and returns the number
//    of times that the needle crossed at least one grid line.
//
//    If L is larger than sqrt ( A*A + B*B ), then the needle will
//    cross every time, and the computation is uninteresting.  However, if
//    L is smaller than this limit, then the probability of a crossing on
//    a single trial is
//
//      P(L,A,B) = ( 2 * L * ( A + B ) - L * L ) / ( PI * A * B )
//
//    and therefore, a record of the number of hits for a given number of
//    trials can be used as a very roundabout way of estimating PI.
//    (Particularly roundabout, since we actually will use a good value of
//    PI in order to pick the random angles.)
//
//    Since this routine invokes the C++ random number generator,
//    the user should initialize the random number generator, particularly
//    if it is desired to control whether the sequence is to be varied
//    or repeated.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 February 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Sudarshan Raghunathan,
//    Making a Supercomputer Do What You Want: High Level Tools for
//    Parallel Programming,
//    Computing in Science and Engineering,
//    Volume 8, Number 5, September/October 2006, pages 70-80.
//
//  Parameters:
//
//    Input, double A, B, the horizontal and vertical dimensions
//    of each cell of the grid.  0 <= A, 0 <= B.
//
//    Input, double L, the length of the needle.
//    0 <= L <= min ( A, B ).
//
//    Input, int TRIAL_NUM, the number of times the needle is
//    to be dropped onto the grid.
//
//    Output, int BUFFON_BOX_SAMPLE, the number of times the needle
//    crossed at least one line of the grid of cells.
//
{
  double angle;
  int hits;
  const double r8_pi = 3.141592653589793238462643;
  int trial;
  double x1;
  double x2;
  double y1;
  double y2;

  hits = 0;

  for ( trial = 1; trial <= trial_num; trial++ )
  {
//
//  Randomly choose the location of the eye of the needle in [0,0]x[A,B],
//  and the angle the needle makes.
//
    x1 = a * static_cast< double > ( rand ( )) / static_cast< double > (RAND_MAX);
    y1 = b * static_cast< double > ( rand ( )) / static_cast< double > (RAND_MAX);
    angle = 2.0 * r8_pi * static_cast< double > (rand ( )) / static_cast< double > (RAND_MAX);
//
//  Compute the location of the point of the needle.
//
    x2 = x1 + l * cos ( angle );
    y2 = y1 + l * sin ( angle );
//
//  Count the end locations that lie outside the cell.
//
    if ( x2 <= 0.0 || a <= x2 || y2 <= 0.0 || b <= y2 )
    {
      hits = hits + 1;
    }
  }
  return hits;
}